

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

int __thiscall glcts::SeparateShaderObjsTests::init(SeparateShaderObjsTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  CreateShadProgCase *this_00;
  UseProgStagesCase *this_01;
  PipelineApiCase *this_02;
  ProgramUniformCase *this_03;
  StateInteractionCase *this_04;
  TestNode *pTVar1;
  SeparateShaderObjsTests *this_local;
  
  this_00 = (CreateShadProgCase *)operator_new(0x80);
  CreateShadProgCase::CreateShadProgCase
            (this_00,(this->super_TestCaseGroup).m_context,"CreateShadProgApi",
             "createShaderProgram API",this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (UseProgStagesCase *)operator_new(0x80);
  UseProgStagesCase::UseProgStagesCase
            (this_01,(this->super_TestCaseGroup).m_context,"UseProgStagesApi","useProgramStages API"
             ,this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (PipelineApiCase *)operator_new(0x80);
  PipelineApiCase::PipelineApiCase
            (this_02,(this->super_TestCaseGroup).m_context,"PipelineApi","Pipeline API",
             this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (ProgramUniformCase *)operator_new(0x80);
  ProgramUniformCase::ProgramUniformCase
            (this_03,(this->super_TestCaseGroup).m_context,"ProgUniformAPI","ProgramUniform API",
             this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (StateInteractionCase *)operator_new(0x80);
  StateInteractionCase::StateInteractionCase
            (this_04,(this->super_TestCaseGroup).m_context,"StateInteraction",
             "SSO State Interactions",this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pTVar1 = (TestNode *)operator_new(0x80);
  InterfaceMatchingCaseFloat::InterfaceMatchingCaseFloat
            ((InterfaceMatchingCaseFloat *)pTVar1,(this->super_TestCaseGroup).m_context,
             "InterfacePrecisionMatchingFloat",this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  InterfaceMatchingCaseInt::InterfaceMatchingCaseInt
            ((InterfaceMatchingCaseInt *)pTVar1,(this->super_TestCaseGroup).m_context,
             "InterfacePrecisionMatchingInt",this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  InterfaceMatchingCaseUInt::InterfaceMatchingCaseUInt
            ((InterfaceMatchingCaseUInt *)pTVar1,(this->super_TestCaseGroup).m_context,
             "InterfacePrecisionMatchingUInt",this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void SeparateShaderObjsTests::init(void)
{

	// API validation for CreateShaderProgram
	addChild(new CreateShadProgCase(m_context, "CreateShadProgApi", "createShaderProgram API", m_glslVersion));
	// API validation for UseProgramStages
	addChild(new UseProgStagesCase(m_context, "UseProgStagesApi", "useProgramStages API", m_glslVersion));
	// API validation for pipeline related functions
	addChild(new PipelineApiCase(m_context, "PipelineApi", "Pipeline API", m_glslVersion));
	// API validation for variations of ProgramUniform
	addChild(new ProgramUniformCase(m_context, "ProgUniformAPI", "ProgramUniform API", m_glslVersion));
	// State interactions
	addChild(new StateInteractionCase(m_context, "StateInteraction", "SSO State Interactions", m_glslVersion));
	// input / output precision matching
	addChild(new InterfaceMatchingCaseFloat(m_context, "InterfacePrecisionMatchingFloat", m_glslVersion));
	addChild(new InterfaceMatchingCaseInt(m_context, "InterfacePrecisionMatchingInt", m_glslVersion));
	addChild(new InterfaceMatchingCaseUInt(m_context, "InterfacePrecisionMatchingUInt", m_glslVersion));
}